

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseFilters::addTags(TestCaseFilters *this,string *tagPattern)

{
  TagExpression exp;
  value_type local_78;
  TagParser local_58;
  undefined1 local_50;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>_>
  local_48;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)&local_78;
  local_78.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_58._vptr_TagParser = (_func_int **)&PTR__TagExpressionParser_00152858;
  local_50 = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  TagParser::parse(&local_58,tagPattern);
  local_58._vptr_TagParser = (_func_int **)&PTR__TagExpressionParser_00152858;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>_>
  ::~_Rb_tree(&local_48);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::push_back
            (&this->m_tagExpressions,&local_78);
  std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::~vector(&local_78.m_tagSets);
  return;
}

Assistant:

void addTags( std::string const& tagPattern ) {
            TagExpression exp;
            TagExpressionParser( exp ).parse( tagPattern );

            m_tagExpressions.push_back( exp );
        }